

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis
          (ParallelFunctionAnalysis<std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
           *this,Module *wasm,Func *work)

{
  _Rb_tree_header *p_Var1;
  Map *map;
  pointer puVar2;
  Function *__args;
  Module *module;
  mapped_type *__args_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar3;
  undefined1 local_2a8 [8];
  PassRunner runner;
  function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
  local_58;
  Module *local_38;
  
  this->wasm = wasm;
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map = &this->map;
  puVar2 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = wasm;
  for (puVar3 = (wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    runner.skippedPasses._M_h._M_single_bucket =
         (__node_base_ptr)
         (puVar3->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::
    map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
    ::operator[]((map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                  *)map,(key_type *)&runner.skippedPasses._M_h._M_single_bucket);
  }
  puVar2 = (local_38->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (local_38->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; module = local_38, puVar3 != puVar2;
      puVar3 = puVar3 + 1) {
    __args = (puVar3->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(__args->super_Importable).module + 8) != (char *)0x0) {
      runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)__args;
      __args_1 = std::
                 map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                 ::operator[]((map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                               *)map,(key_type *)&runner.skippedPasses._M_h._M_single_bucket);
      std::
      function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
      ::operator()((function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
                    *)work,__args,__args_1);
    }
  }
  PassRunner::PassRunner((PassRunner *)local_2a8,local_38);
  std::
  function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
  ::function(&local_58,
             (function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
              *)work);
  ParallelFunctionAnalysis<std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::
  function<void(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)>)::
  Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,std::unordered_map<wasm::Name,std::
  vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::
  equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>>>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::
  Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::
  Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>>>>&,std::
  function<void(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression_>_>_>_>_>__>_
            (&runner.skippedPasses._M_h._M_single_bucket,module,map,(Func *)&local_58);
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)
             &runner.skippedPasses._M_h._M_single_bucket,(PassRunner *)local_2a8,module);
  ParallelFunctionAnalysis::Mapper::~Mapper((Mapper *)&runner.skippedPasses._M_h._M_single_bucket);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  PassRunner::~PassRunner((PassRunner *)local_2a8);
  return;
}

Assistant:

ParallelFunctionAnalysis(Module& wasm, Func work) : wasm(wasm) {
    // Fill in map, as we operate on it in parallel (each function to its own
    // entry).
    for (auto& func : wasm.functions) {
      map[func.get()];
    }

    // Run on the imports first. TODO: parallelize this too
    for (auto& func : wasm.functions) {
      if (func->imported()) {
        work(func.get(), map[func.get()]);
      }
    }

    struct Mapper : public WalkerPass<PostWalker<Mapper>> {
      bool isFunctionParallel() override { return true; }
      bool modifiesBinaryenIR() override { return Mut; }

      Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }

      void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }

    private:
      Module& module;
      Map& map;
      Func work;
    };

    PassRunner runner(&wasm);
    Mapper(wasm, map, work).run(&runner, &wasm);
  }